

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O3

bool __thiscall libcellml::Model::replaceUnits(Model *this,size_t index,UnitsPtr *units)

{
  EntityImpl *pEVar1;
  bool bVar2;
  UnitsImpl *this_00;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  ParentedEntityPtr local_38;
  
  bVar2 = removeUnits(this,index);
  if (bVar2) {
    pEVar1 = (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
             mPimpl;
    std::
    vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>::
    insert((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
            *)&pEVar1[4].mId._M_string_length,
           (shared_ptr<libcellml::Units> *)(index * 0x10 + pEVar1[4].mId._M_string_length),units);
    this_00 = Units::pFunc((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)
                           ._M_ptr);
    std::__shared_ptr<libcellml::Model,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libcellml::Model,void>
              ((__shared_ptr<libcellml::Model,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (__weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<libcellml::Model>);
    local_38.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_48;
    local_38.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Stack_40;
    local_48 = (element_type *)0x0;
    p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ParentedEntity::ParentedEntityImpl::setParent((ParentedEntityImpl *)this_00,&local_38);
    if (local_38.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
    }
  }
  return bVar2;
}

Assistant:

bool Model::replaceUnits(size_t index, const UnitsPtr &units)
{
    bool status = false;
    if (removeUnits(index)) {
        pFunc()->mUnits.insert(pFunc()->mUnits.begin() + ptrdiff_t(index), units);
        units->pFunc()->setParent(shared_from_this());
        status = true;
    }

    return status;
}